

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  ulong local_38;
  int arr [5];
  char **argv_local;
  int argc_local;
  
  local_38 = 0x500000001;
  arr[0] = 4;
  arr[1] = 2;
  arr[2] = 4;
  printf("Array is [%d, %d, %d, %d, %d].\n",1,5,4,2,4);
  bubble_sort((int *)&local_38,5);
  printf("The sorted array is [%d, %d, %d, %d, %d].\n",local_38 & 0xffffffff,local_38 >> 0x20,
         arr._0_8_ & 0xffffffff,(ulong)arr._0_8_ >> 0x20,(ulong)(uint)arr[2]);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  int arr[ARR_LEN] = {1, 5, 4, 2, 4};
  printf("Array is [%d, %d, %d, %d, %d].\n", arr[0], arr[1], arr[2], arr[3], arr[4]);

  bubble_sort(arr, ARR_LEN);

  printf("The sorted array is [%d, %d, %d, %d, %d].\n", arr[0], arr[1], arr[2], arr[3], arr[4]);
  return 0;
}